

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O3

int stbi__compute_transparency16(stbi__png *z,stbi__uint16 *tc,int out_n)

{
  int in_EAX;
  short *in_RCX;
  undefined4 in_register_00000014;
  long lVar1;
  int iVar2;
  int in_R8D;
  
  iVar2 = (int)z * (int)tc;
  if (in_R8D == 2) {
    if (iVar2 != 0) {
      lVar1 = 0;
      do {
        *(ushort *)(CONCAT44(in_register_00000014,out_n) + 2 + lVar1 * 4) =
             -(ushort)(*(short *)(CONCAT44(in_register_00000014,out_n) + lVar1 * 4) != *in_RCX);
        lVar1 = lVar1 + 1;
        in_EAX = iVar2;
      } while (iVar2 != (int)lVar1);
    }
  }
  else if (iVar2 != 0) {
    lVar1 = 0;
    do {
      if (((*(short *)(CONCAT44(in_register_00000014,out_n) + lVar1 * 8) == *in_RCX) &&
          (*(short *)(CONCAT44(in_register_00000014,out_n) + 2 + lVar1 * 8) == in_RCX[1])) &&
         (*(short *)(CONCAT44(in_register_00000014,out_n) + 4 + lVar1 * 8) == in_RCX[2])) {
        *(undefined2 *)(CONCAT44(in_register_00000014,out_n) + 6 + lVar1 * 8) = 0;
      }
      lVar1 = lVar1 + 1;
      in_EAX = iVar2;
    } while (iVar2 != (int)lVar1);
  }
  return in_EAX;
}

Assistant:

static int stbi__compute_transparency16(stbi__png *z, stbi__uint16 tc[3], int out_n)
{
   stbi__context *s = z->s;
   stbi__uint32 i, pixel_count = s->img_x * s->img_y;
   stbi__uint16 *p = (stbi__uint16*) z->out;

   // compute color-based transparency, assuming we've
   // already got 65535 as the alpha value in the output
   STBI_ASSERT(out_n == 2 || out_n == 4);

   if (out_n == 2) {
      for (i = 0; i < pixel_count; ++i) {
         p[1] = (p[0] == tc[0] ? 0 : 65535);
         p += 2;
      }
   } else {
      for (i = 0; i < pixel_count; ++i) {
         if (p[0] == tc[0] && p[1] == tc[1] && p[2] == tc[2])
            p[3] = 0;
         p += 4;
      }
   }
   return 1;
}